

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O2

longlong __thiscall std::pmr::test_resource::status(test_resource *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  longlong lVar4;
  
  mutex::lock(&this->m_lock_);
  lVar3 = (this->m_bounds_errors_).super___atomic_base<long_long>._M_i +
          (this->m_mismatches_).super___atomic_base<long_long>._M_i;
  lVar1 = (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i;
  lVar2 = lVar1 + lVar3;
  if (lVar2 == 0 || SCARRY8(lVar1,lVar3) != lVar2 < 0) {
    if (((this->m_blocks_in_use_).super___atomic_base<long_long>._M_i < 1) &&
       ((long)(this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i < 1)) {
      lVar4 = 0;
    }
    else {
      lVar4 = -1;
    }
  }
  else {
    lVar4 = (longlong)(int)lVar2;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock_);
  return lVar4;
}

Assistant:

long long test_resource::status() const noexcept
{
    static const int memoryLeak = -1;
    static const int success = 0;

    lock_guard guard{ m_lock_ };

    const long long numErrors = mismatches() + bounds_errors() +
                                bad_deallocate_params();

    if (numErrors > 0) {
        return static_cast<int>(numErrors);                           // RETURN
    }
    else if (has_allocations()) {
        return memoryLeak;                                            // RETURN
    }
    else {
        return success;                                               // RETURN
    }
}